

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O0

void __thiscall imrt::Collimator::printIntensityLevels(Collimator *this)

{
  ostream *poVar1;
  size_type sVar2;
  reference pvVar3;
  long in_RDI;
  int i;
  int local_c;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Intensity levels: ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_c = 0;
  while( true ) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x168));
    if (sVar2 <= (ulong)(long)local_c) break;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x168),(long)local_c);
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,*pvVar3);
    std::operator<<(poVar1," ");
    local_c = local_c + 1;
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Collimator::printIntensityLevels (){
    cout << "Intensity levels: "<< endl;
    for (int i=0; i<levels_to_intensity.size(); i++){
      cout << levels_to_intensity[i] <<  " ";
    }
    cout << endl;
  }